

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> * __thiscall
dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::operator=
          (any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> *this
          ,any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> *item
          )

{
  any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> *in_RDI;
  any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> *item_00;
  any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>
  *in_stack_ffffffffffffffd8;
  any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>
  *in_stack_ffffffffffffffe0;
  any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL> local_18 [3];
  
  item_00 = local_18;
  any_function(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  swap(in_RDI,item_00);
  ~any_function((any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>
                 *)0x497845);
  return in_RDI;
}

Assistant:

any_function& operator= (
    const any_function& item
)
{
    any_function(item).swap(*this);
    return *this;
}